

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

uint32_t membr_next_rarvm_number(memory_bit_reader *br)

{
  uint32_t uVar1;
  uint32_t val;
  memory_bit_reader *br_local;
  
  uVar1 = membr_bits(br,2);
  if (uVar1 == 0) {
    br_local._4_4_ = membr_bits(br,4);
  }
  else if (uVar1 == 1) {
    br_local._4_4_ = membr_bits(br,8);
    if (br_local._4_4_ < 0x10) {
      uVar1 = membr_bits(br,4);
      br_local._4_4_ = br_local._4_4_ << 4 | 0xffffff00 | uVar1;
    }
  }
  else if (uVar1 == 2) {
    br_local._4_4_ = membr_bits(br,0x10);
  }
  else {
    br_local._4_4_ = membr_bits(br,0x20);
  }
  return br_local._4_4_;
}

Assistant:

static uint32_t
membr_next_rarvm_number(struct memory_bit_reader *br)
{
  uint32_t val;
  switch (membr_bits(br, 2))
  {
    case 0:
      return membr_bits(br, 4);
    case 1:
      val = membr_bits(br, 8);
      if (val >= 16)
        return val;
      return 0xFFFFFF00 | (val << 4) | membr_bits(br, 4);
    case 2:
      return membr_bits(br, 16);
    default:
      return membr_bits(br, 32);
  }
}